

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

void __thiscall
GLRState::GLRState(GLRState *this,string *name,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *productions)

{
  _Rb_tree_header *p_Var1;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->accepting = false;
  p_Var1 = &(this->prodEstablished)._M_t._M_impl.super__Rb_tree_header;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->productions)._M_t._M_impl.super__Rb_tree_header,
             &(productions->_M_t)._M_impl.super__Rb_tree_header);
  p_Var1 = &(this->statesTo)._M_t._M_impl.super__Rb_tree_header;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

GLRState::GLRState(std::string name, std::set<Production *> productions) : name(std::move(name)),
                                                                           productions(std::move(productions)),
                                                                           accepting(false) {
//    prodEstablished = productions.size();
}